

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::WasmByteCodeWriter::TryWriteFloat32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,int C1,int C2,int C3,int C4)

{
  bool bVar1;
  uint local_40;
  int iStack_3c;
  OpLayoutT_Float32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  int C3_local;
  int C2_local;
  int C1_local;
  RegSlot R0_local;
  OpCodeAsmJs op_local;
  WasmByteCodeWriter *this_local;
  
  layout.C3 = C3;
  layout.C4 = C2;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&local_40,R0);
  if ((((bVar1) && (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<int>(&iStack_3c,C1), bVar1))
      && (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<int>((int *)&layout,layout.C4), bVar1)
      ) && ((bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<int>(&layout.C1,layout.C3), bVar1
            && (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<int>(&layout.C2,C4), bVar1)))) {
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_40,0x14,
               &this->super_ByteCodeWriter,false);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteFloat32x4_IntConst4(OpCodeAsmJs op, RegSlot R0, int C1, int C2, int C3, int C4)
    {
        OpLayoutT_Float32x4_IntConst4<SizePolicy> layout;
        if (SizePolicy::Assign(layout.F4_0, R0) && 
            SizePolicy::Assign(layout.C1, C1) && 
            SizePolicy::Assign(layout.C2, C2) &&
            SizePolicy::Assign(layout.C3, C3) &&
            SizePolicy::Assign(layout.C4, C4)
            )
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }